

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iCur;
  Parse *pParse;
  bool bVar7;
  bool bVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  WhereTerm *pWVar14;
  CollSeq *pCVar15;
  Bitmask BVar16;
  ulong uVar17;
  short sVar18;
  ulong uVar19;
  byte bVar20;
  WhereLoop *pWVar21;
  ulong uVar22;
  bool bVar23;
  uint uVar24;
  Expr *pEVar25;
  ExprList_item *pEVar26;
  undefined6 in_register_00000082;
  ulong uVar27;
  ulong uVar28;
  Index *pIVar29;
  ExprList_item *pEVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  ulong local_d0;
  ulong local_b8;
  ulong local_a8;
  Walker local_60;
  
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) ||
     ((pWInfo->pParse->db->dbOptFlags & 0x40) == 0)) {
    uVar4 = (ushort)pOrderBy->nExpr;
    uVar19 = (ulong)uVar4;
    uVar17 = 0;
    if (uVar4 < 0x40) {
      uVar13 = ~(-1L << ((byte)uVar4 & 0x3f));
      uVar10 = ((wctrlFlags >> 0xb & 1) != 0) + 0x182;
      if (uVar4 != 0) {
        pEVar30 = pOrderBy->a;
        bVar33 = true;
        local_d0 = 0;
        local_b8 = 0;
        uVar28 = 0;
        pWVar21 = (WhereLoop *)0x0;
        uVar17 = 0;
        do {
          if (uVar17 != 0) {
            local_d0 = local_d0 | pWVar21->maskSelf;
          }
          pWVar21 = pLast;
          if ((nLoop <= uVar17) || (pWVar21 = pPath->aLoop[uVar17], (wctrlFlags >> 0xb & 1) == 0)) {
            if ((pWVar21->wsFlags & 0x400) != 0) {
              if ((pWVar21->u).vtab.isOrdered != '\0') {
                uVar28 = uVar13;
              }
              goto LAB_0018e8e3;
            }
            (pWVar21->u).btree.nIdxCol = 0;
            iCur = pWInfo->pTabList->a[pWVar21->iTab].iCursor;
            uVar31 = 0;
            do {
              if ((uVar28 >> (uVar31 & 0x3f) & 1) == 0) {
                pEVar25 = pEVar30[uVar31].pExpr;
                while ((pEVar25 != (Expr *)0x0 && ((pEVar25->flags >> 0xc & 1) != 0))) {
                  if ((pEVar25->flags >> 0x12 & 1) == 0) {
                    pEVar26 = (ExprList_item *)&pEVar25->pLeft;
                  }
                  else {
                    pEVar26 = ((pEVar25->x).pList)->a;
                  }
                  pEVar25 = pEVar26->pExpr;
                }
                if (((pEVar25->op == 0xa2) && (pEVar25->iTable == iCur)) &&
                   (pWVar14 = sqlite3WhereFindTerm
                                        (&pWInfo->sWC,iCur,(int)pEVar25->iColumn,~local_d0,uVar10,
                                         (Index *)0x0), pWVar14 != (WhereTerm *)0x0)) {
                  if (pWVar14->eOperator == 1) {
                    uVar22 = (ulong)pWVar21->nLTerm;
                    bVar32 = uVar22 != 0;
                    if (bVar32) {
                      if (pWVar14 != *pWVar21->aLTerm) {
                        uVar27 = 0;
                        do {
                          if (uVar22 - 1 == uVar27) goto LAB_0018e39c;
                          uVar1 = uVar27 + 1;
                          lVar9 = uVar27 + 1;
                          uVar27 = uVar1;
                        } while (pWVar14 != pWVar21->aLTerm[lVar9]);
                        bVar32 = uVar1 < uVar22;
                      }
                      if (bVar32) goto LAB_0018e349;
                    }
                  }
                  else {
LAB_0018e349:
                    if ((((pWVar14->eOperator & 0x82) == 0) || (pEVar25->iColumn < 0)) ||
                       (iVar11 = sqlite3ExprCollSeqMatch
                                           (pWInfo->pParse,pEVar30[uVar31].pExpr,pWVar14->pExpr),
                       iVar11 != 0)) {
                      uVar28 = uVar28 | 1L << ((byte)uVar31 & 0x3f);
                    }
                  }
                }
              }
LAB_0018e39c:
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar4);
            if ((pWVar21->wsFlags >> 0xc & 1) == 0) {
              if ((pWVar21->wsFlags >> 8 & 1) == 0) {
                pIVar29 = (pWVar21->u).btree.pIndex;
                if ((pIVar29 == (Index *)0x0) || ((pIVar29->field_0x63 & 4) != 0))
                goto LAB_0018e923;
                local_a8 = (ulong)pIVar29->nKeyCol;
                uVar12 = (uint)pIVar29->nColumn;
                bVar33 = pIVar29->onError != '\0';
              }
              else {
                uVar12 = 1;
                local_a8 = 0;
                pIVar29 = (Index *)0x0;
              }
              if (uVar12 == 0) {
                bVar32 = true;
              }
              else {
                uVar31 = 0;
                bVar8 = false;
                bVar20 = 0;
                bVar32 = false;
                do {
                  uVar5 = (pWVar21->u).btree.nEq;
                  bVar7 = true;
                  if ((uVar31 < uVar5) && (pWVar21->nSkip <= uVar31)) {
                    pWVar14 = pWVar21->aLTerm[uVar31];
                    uVar6 = pWVar14->eOperator;
                    if ((uVar10 & uVar6) == 0) {
                      bVar7 = true;
                      if ((uVar6 & 1) != 0) {
                        uVar22 = uVar31;
                        do {
                          if (uVar5 - 1 == uVar22) goto LAB_0018e4da;
                          lVar9 = uVar22 + 1;
                          uVar22 = uVar22 + 1;
                        } while (pWVar21->aLTerm[lVar9]->pExpr != pWVar14->pExpr);
                        bVar7 = false;
                      }
                    }
                    else {
                      if ((uVar6 >> 8 & 1) != 0) {
                        bVar33 = false;
                      }
                      bVar7 = true;
                    }
LAB_0018e4da:
                    bVar23 = true;
                    if ((uVar10 & uVar6) == 0) goto LAB_0018e4e6;
                  }
                  else {
LAB_0018e4e6:
                    if (pIVar29 == (Index *)0x0) {
                      bVar2 = 0;
                      uVar24 = 0xffffffff;
                    }
                    else {
                      sVar18 = pIVar29->aiColumn[uVar31];
                      bVar2 = pIVar29->aSortOrder[uVar31];
                      if (sVar18 == pIVar29->pTable->iPKey) {
                        sVar18 = -1;
                      }
                      uVar24 = (uint)sVar18;
                    }
                    if ((((uVar5 <= uVar31) && (bVar33)) && (-1 < (int)uVar24)) &&
                       (pIVar29->pTable->aCol[uVar24].notNull == '\0')) {
                      bVar33 = false;
                    }
                    uVar22 = 0;
                    bVar23 = bVar7;
                    if (bVar7) {
                      do {
                        if ((uVar28 >> (uVar22 & 0x3f) & 1) == 0) {
                          pEVar25 = pEVar30[uVar22].pExpr;
                          while ((pEVar25 != (Expr *)0x0 && ((pEVar25->flags >> 0xc & 1) != 0))) {
                            if ((pEVar25->flags >> 0x12 & 1) == 0) {
                              pEVar26 = (ExprList_item *)&pEVar25->pLeft;
                            }
                            else {
                              pEVar26 = ((pEVar25->x).pList)->a;
                            }
                            pEVar25 = pEVar26->pExpr;
                          }
                          if ((wctrlFlags & 0xc0) == 0) {
                            bVar7 = false;
                          }
                          if ((int)uVar24 < -1) {
                            iVar11 = sqlite3ExprCompareSkip
                                               (pEVar25,pIVar29->aColExpr->a[uVar31].pExpr,iCur);
                            if (iVar11 == 0) goto LAB_0018e62a;
                          }
                          else if (((pEVar25->op == 0xa2) && (pEVar25->iTable == iCur)) &&
                                  (uVar24 == (int)pEVar25->iColumn)) {
LAB_0018e62a:
                            if (uVar24 != 0xffffffff) {
                              pParse = pWInfo->pParse;
                              pCVar15 = sqlite3ExprCollSeq(pParse,pEVar30[uVar22].pExpr);
                              if (pCVar15 == (CollSeq *)0x0) {
                                pCVar15 = pParse->db->pDfltColl;
                              }
                              iVar11 = sqlite3StrICmp(pCVar15->zName,pIVar29->azColl[uVar31]);
                              if (iVar11 != 0) goto LAB_0018e578;
                            }
                            (pWVar21->u).btree.nIdxCol = (short)uVar31 + 1;
                            bVar7 = true;
                            goto LAB_0018e6a6;
                          }
                        }
LAB_0018e578:
                        uVar22 = uVar22 + 1;
                        bVar23 = uVar22 < uVar4 && bVar7;
                      } while (bVar23);
                      bVar7 = false;
                    }
                    else {
                      bVar7 = false;
                    }
LAB_0018e6a6:
                    if (((wctrlFlags & 0x40) == 0) && (bVar23)) {
                      if (bVar8) {
                        if ((bVar2 ^ bVar20) != pOrderBy->a[uVar22 & 0xffffffff].sortOrder) {
                          bVar7 = false;
                        }
                        bVar8 = true;
                      }
                      else {
                        bVar3 = pOrderBy->a[uVar22 & 0xffffffff].sortOrder;
                        bVar20 = bVar3 ^ bVar2;
                        bVar8 = true;
                        if (bVar3 != bVar2) {
                          *pRevMask = *pRevMask | 1L << ((byte)uVar17 & 0x3f);
                        }
                      }
                    }
                    if (bVar7) {
                      if (uVar24 == 0xffffffff) {
                        bVar32 = true;
                      }
                      uVar28 = uVar28 | 1L << (uVar22 & 0x3f);
                      bVar23 = true;
                    }
                    else {
                      bVar23 = false;
                      if (uVar31 < local_a8) {
                        bVar33 = bVar23;
                      }
                      if (uVar31 == 0) {
                        bVar33 = false;
                      }
                    }
                  }
                } while ((bVar23) && (uVar31 = uVar31 + 1, uVar31 < uVar12));
                bVar32 = !bVar32;
              }
              bVar32 = (bool)(!bVar33 & bVar32);
            }
            else {
              bVar32 = false;
            }
            if (bVar32) {
              bVar33 = false;
            }
            else {
              local_b8 = local_b8 | pWVar21->maskSelf;
              uVar31 = 0;
              pEVar26 = pEVar30;
              do {
                uVar22 = 1L << ((byte)uVar31 & 0x3f);
                if ((uVar28 >> (uVar31 & 0x3f) & 1) == 0) {
                  pEVar25 = pEVar26->pExpr;
                  if (pEVar25 == (Expr *)0x0) {
                    BVar16 = 0;
                  }
                  else {
                    BVar16 = sqlite3WhereExprUsageNN(&pWInfo->sMaskSet,pEVar25);
                  }
                  if (BVar16 == 0) {
                    local_60.eCode = '\x01';
                    local_60.xExprCallback = exprNodeIsConstant;
                    local_60.xSelectCallback = sqlite3SelectWalkFail;
                    local_60.u.n = 0;
                    if (pEVar25 != (Expr *)0x0) {
                      walkExpr(&local_60,pEVar25);
                    }
                    if (local_60.eCode == '\0') goto LAB_0018e88c;
                  }
                  if ((BVar16 & ~local_b8) != 0) {
                    uVar22 = 0;
                  }
                  uVar28 = uVar28 | uVar22;
                }
LAB_0018e88c:
                uVar31 = uVar31 + 1;
                pEVar26 = pEVar26 + 1;
              } while (uVar19 != uVar31);
              bVar33 = true;
            }
          }
          if (((!bVar33) || (uVar13 <= uVar28)) ||
             (bVar32 = nLoop <= uVar17, uVar17 = uVar17 + 1, bVar32)) goto LAB_0018e8e3;
        } while( true );
      }
      bVar33 = true;
      uVar28 = 0;
LAB_0018e8e3:
      uVar17 = uVar19;
      if ((uVar28 != uVar13) && (uVar17 = 0xff, !bVar33)) {
        uVar10 = (uint)uVar4;
        do {
          uVar10 = uVar10 - 1;
          if ((long)uVar19 < 2) goto LAB_0018e923;
          uVar19 = uVar19 - 1;
        } while ((-1L << ((byte)uVar19 & 0x3f) | uVar28) != 0xffffffffffffffff);
        uVar17 = (ulong)(uVar10 & 0xff);
      }
    }
  }
  else {
LAB_0018e923:
    uVar17 = 0;
  }
  return (i8)uVar17;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        if( sqlite3ExprCollSeqMatch(pWInfo->pParse, 
                  pOrderBy->a[i].pExpr, pTerm->pExpr)==0 ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}